

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

bool __thiscall leveldb::Block::Iter::ParseNextKey(Iter *this)

{
  byte *limit;
  byte bVar1;
  char *pcVar2;
  uint32_t uVar3;
  byte *pbVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  byte *pbVar9;
  uint32_t non_shared;
  uint32_t value_length;
  uint32_t shared;
  uint local_2c;
  uint local_28;
  uint local_24;
  
  pcVar2 = this->data_;
  pcVar6 = (this->value_).data_ + ((this->value_).size_ - (long)pcVar2);
  uVar5 = (uint)pcVar6;
  this->current_ = uVar5;
  uVar8 = this->restarts_;
  if (uVar8 <= uVar5) {
    this->current_ = uVar8;
    this->restart_index_ = this->num_restarts_;
    return false;
  }
  uVar7 = (ulong)pcVar6 & 0xffffffff;
  if ((long)(uVar8 - uVar7) < 3) {
LAB_00126222:
    pbVar4 = (byte *)0x0;
  }
  else {
    limit = (byte *)(pcVar2 + uVar8);
    pbVar9 = (byte *)(pcVar2 + uVar7);
    local_24 = (uint)*pbVar9;
    local_2c = (uint)pbVar9[1];
    local_28 = (uint)pbVar9[2];
    if ((byte)(pbVar9[1] | *pbVar9 | pbVar9[2]) < 0x80) {
      pbVar9 = pbVar9 + 3;
    }
    else {
      if (uVar5 < uVar8) {
        uVar8 = (uint)(char)*pbVar9;
        pbVar4 = (byte *)(ulong)uVar8;
        if ((int)uVar8 < 0) goto LAB_0012630b;
        pbVar9 = pbVar9 + 1;
        local_24 = uVar8;
      }
      else {
LAB_0012630b:
        pbVar4 = (byte *)GetVarint32PtrFallback((char *)pbVar9,(char *)limit,&local_24);
        pbVar9 = pbVar4;
      }
      if (pbVar9 == (byte *)0x0) goto LAB_00126222;
      if (pbVar9 < limit) {
        bVar1 = *pbVar9;
        if (-1 < (char)bVar1) {
          pbVar4 = pbVar9 + 1;
          local_2c = (int)(char)bVar1;
        }
        if ((char)bVar1 < '\0') goto LAB_0012633e;
      }
      else {
LAB_0012633e:
        pbVar4 = (byte *)GetVarint32PtrFallback((char *)pbVar9,(char *)limit,&local_2c);
      }
      if (pbVar4 == (byte *)0x0) goto LAB_00126222;
      if (pbVar4 < limit) {
        bVar1 = *pbVar4;
        if (-1 < (char)bVar1) {
          pbVar9 = pbVar4 + 1;
          local_28 = (int)(char)bVar1;
        }
        if ((char)bVar1 < '\0') goto LAB_0012636e;
      }
      else {
LAB_0012636e:
        pbVar9 = (byte *)GetVarint32PtrFallback((char *)pbVar4,(char *)limit,&local_28);
      }
      if (pbVar9 == (byte *)0x0) goto LAB_00126222;
    }
    pbVar4 = (byte *)0x0;
    if (local_28 + local_2c <= (uint)((int)limit - (int)pbVar9)) {
      pbVar4 = pbVar9;
    }
  }
  if ((pbVar4 != (byte *)0x0) && ((ulong)local_24 <= (this->key_)._M_string_length)) {
    std::__cxx11::string::resize((ulong)&this->key_,(char)local_24);
    std::__cxx11::string::append((char *)&this->key_,(ulong)pbVar4);
    (this->value_).data_ = (char *)(pbVar4 + local_2c);
    (this->value_).size_ = (ulong)local_28;
    uVar8 = this->restart_index_ + 1;
    while( true ) {
      if (this->num_restarts_ <= uVar8) {
        return true;
      }
      uVar3 = GetRestartPoint(this,uVar8);
      if (this->current_ <= uVar3) break;
      uVar3 = this->restart_index_;
      this->restart_index_ = uVar3 + 1;
      uVar8 = uVar3 + 2;
    }
    return true;
  }
  CorruptionError(this);
  return false;
}

Assistant:

bool ParseNextKey() {
    current_ = NextEntryOffset();
    const char* p = data_ + current_;
    const char* limit = data_ + restarts_;  // Restarts come right after data
    if (p >= limit) {
      // No more entries to return.  Mark as invalid.
      current_ = restarts_;
      restart_index_ = num_restarts_;
      return false;
    }

    // Decode next entry
    uint32_t shared, non_shared, value_length;
    p = DecodeEntry(p, limit, &shared, &non_shared, &value_length);
    if (p == nullptr || key_.size() < shared) {
      CorruptionError();
      return false;
    } else {
      key_.resize(shared);
      key_.append(p, non_shared);
      value_ = Slice(p + non_shared, value_length);
      while (restart_index_ + 1 < num_restarts_ &&
             GetRestartPoint(restart_index_ + 1) < current_) {
        ++restart_index_;
      }
      return true;
    }
  }